

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::doApply(IRet *__return_storage_ptr__,
         DerivedFunc<vkt::shaderexecutor::Signature<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
         *this,EvalContext *ctx,IArgs *args)

{
  bool *pbVar1;
  long *plVar2;
  Expr<tcu::Vector<float,_3>_> *pEVar3;
  undefined7 uVar4;
  long lVar5;
  pointer pSVar6;
  IVal *pIVar7;
  ulong uVar8;
  double *pdVar9;
  IRet *pIVar10;
  Vector<tcu::Interval,_3> *pVVar11;
  byte bVar12;
  Environment funEnv;
  EvalContext funCtx;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  _Stack_e8;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  YesNoMaybe YStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  double local_98;
  Precision local_90;
  undefined1 *local_88;
  int local_80;
  double local_78 [9];
  
  bVar12 = 0;
  _Stack_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_e8._M_impl.super__Rb_tree_header._M_header;
  _Stack_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar5 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar5 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar5;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x50);
  lVar5 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar5 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar5;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0x50);
  _Stack_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  initialize(this);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&_Stack_e8,
             (this->m_var0).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             args->a);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_e8,
             (this->m_var1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->b);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_e8,
             (this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->c);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_e8,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             args->d);
  local_90 = ctx->floatPrecision;
  local_80 = ctx->callDepth;
  local_98 = (ctx->format).m_maxValue;
  local_b8 = (ctx->format).m_minExp;
  iStack_b4 = (ctx->format).m_maxExp;
  iStack_b0 = (ctx->format).m_fractionBits;
  YStack_ac = (ctx->format).m_hasSubnormal;
  local_a8._0_4_ = (ctx->format).m_hasInf;
  local_a8._4_4_ = (ctx->format).m_hasNaN;
  uStack_a0 = *(undefined8 *)&(ctx->format).m_exactPrecision;
  pSVar6 = (this->m_body).
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (undefined1 *)&_Stack_e8;
  if ((this->m_body).
      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar6) {
    lVar5 = 0;
    uVar8 = 0;
    local_88 = (undefined1 *)&_Stack_e8;
    do {
      plVar2 = *(long **)((long)&(pSVar6->super_SharedPtr<const_vkt::shaderexecutor::Statement>).
                                 m_ptr + lVar5);
      (**(code **)(*plVar2 + 0x18))(plVar2,&local_b8);
      uVar8 = uVar8 + 1;
      pSVar6 = (this->m_body).
               super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x10;
    } while (uVar8 < (ulong)((long)(this->m_body).
                                   super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar6 >> 4));
  }
  pEVar3 = (this->m_ret).super_ContainerExprPBase<tcu::Vector<float,_3>_>.
           super_ExprPBase<tcu::Vector<float,_3>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_3>_>_>.m_ptr;
  (*(pEVar3->super_ExprBase)._vptr_ExprBase[4])(local_78,pEVar3,&local_b8);
  pdVar9 = local_78;
  pIVar10 = __return_storage_ptr__;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(double *)pIVar10->m_data = *pdVar9;
    pdVar9 = pdVar9 + (ulong)bVar12 * -2 + 1;
    pIVar10 = (IRet *)((long)pIVar10 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  pIVar7 = Environment::lookup<tcu::Vector<float,3>>
                     ((Environment *)&_Stack_e8,
                      (this->m_var0).
                      super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                      m_ptr);
  pVVar11 = args->a;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    uVar4 = *(undefined7 *)&pIVar7->m_data[0].field_0x1;
    pVVar11->m_data[0].m_hasNaN = pIVar7->m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar11->m_data[0].field_0x1 = uVar4;
    pIVar7 = (IVal *)((long)pIVar7 + ((ulong)bVar12 * -2 + 1) * 8);
    pVVar11 = (Vector<tcu::Interval,_3> *)((long)pVVar11 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_e8,
             (this->m_var1).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_e8,
             (this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  Environment::lookup<vkt::shaderexecutor::Void>
            ((Environment *)&_Stack_e8,
             (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr)
  ;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&_Stack_e8);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext&	ctx,
												 const IArgs&		args) const
	{
		Environment	funEnv;
		IArgs&		mutArgs		= const_cast<IArgs&>(args);
		IRet		ret;

		initialize();

		funEnv.bind(*m_var0, args.a);
		funEnv.bind(*m_var1, args.b);
		funEnv.bind(*m_var2, args.c);
		funEnv.bind(*m_var3, args.d);

		{
			EvalContext	funCtx(ctx.format, ctx.floatPrecision, funEnv, ctx.callDepth);

			for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
				m_body[ndx]->execute(funCtx);

			ret = m_ret->evaluate(funCtx);
		}

		// \todo [lauri] Store references instead of values in environment
		const_cast<IArg0&>(mutArgs.a) = funEnv.lookup(*m_var0);
		const_cast<IArg1&>(mutArgs.b) = funEnv.lookup(*m_var1);
		const_cast<IArg2&>(mutArgs.c) = funEnv.lookup(*m_var2);
		const_cast<IArg3&>(mutArgs.d) = funEnv.lookup(*m_var3);

		return ret;
	}